

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong mkvparser::ReadID(IMkvReader *pReader,longlong pos,long *len)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uchar temp_byte;
  byte local_39;
  long *local_38;
  
  if (pos < 0 || pReader == (IMkvReader *)0x0) {
    return -2;
  }
  local_39 = 0;
  iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,1);
  if (iVar1 < 0) {
    return -2;
  }
  if (iVar1 != 0) {
    return -3;
  }
  if (local_39 != 0) {
    lVar3 = 0;
    while (-1 < (char)(local_39 << ((byte)lVar3 & 0x1f))) {
      lVar3 = lVar3 + 1;
      if ((int)lVar3 == 4) {
        return -2;
      }
    }
    uVar5 = (ulong)local_39;
    local_38 = len;
    if ((int)lVar3 != 0) {
      lVar4 = pos + 1;
      lVar2 = lVar3;
      do {
        iVar1 = (**pReader->_vptr_IMkvReader)(pReader,lVar4,1,&local_39);
        if (iVar1 < 0) {
          return -2;
        }
        if (iVar1 != 0) {
          return -3;
        }
        uVar5 = uVar5 << 8 | (ulong)local_39;
        lVar4 = lVar4 + 1;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    *local_38 = lVar3 + 1;
    return uVar5;
  }
  return -2;
}

Assistant:

long long ReadID(IMkvReader* pReader, long long pos, long& len) {
  if (pReader == NULL || pos < 0)
    return E_FILE_FORMAT_INVALID;

  // Read the first byte. The length in bytes of the ID is determined by
  // finding the first set bit in the first byte of the ID.
  unsigned char temp_byte = 0;
  int read_status = pReader->Read(pos, 1, &temp_byte);

  if (read_status < 0)
    return E_FILE_FORMAT_INVALID;
  else if (read_status > 0)  // No data to read.
    return E_BUFFER_NOT_FULL;

  if (temp_byte == 0)  // ID length > 8 bytes; invalid file.
    return E_FILE_FORMAT_INVALID;

  int bit_pos = 0;
  const int kMaxIdLengthInBytes = 4;
  const int kCheckByte = 0x80;

  // Find the first bit that's set.
  bool found_bit = false;
  for (; bit_pos < kMaxIdLengthInBytes; ++bit_pos) {
    if ((kCheckByte >> bit_pos) & temp_byte) {
      found_bit = true;
      break;
    }
  }

  if (!found_bit) {
    // The value is too large to be a valid ID.
    return E_FILE_FORMAT_INVALID;
  }

  // Read the remaining bytes of the ID (if any).
  const int id_length = bit_pos + 1;
  long long ebml_id = temp_byte;
  for (int i = 1; i < id_length; ++i) {
    ebml_id <<= 8;
    read_status = pReader->Read(pos + i, 1, &temp_byte);

    if (read_status < 0)
      return E_FILE_FORMAT_INVALID;
    else if (read_status > 0)
      return E_BUFFER_NOT_FULL;

    ebml_id |= temp_byte;
  }

  len = id_length;
  return ebml_id;
}